

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# flat_hash_map.hpp
# Opt level: O0

pair<ska::detailv3::sherwood_v3_table<std::pair<const_slang::ast::Scope_*,_const_slang::ast::Symbol_*>,_const_slang::ast::Scope_*,_slang::Hasher<const_slang::ast::Scope_*>,_ska::detailv3::KeyOrValueHasher<const_slang::ast::Scope_*,_std::pair<const_slang::ast::Scope_*,_const_slang::ast::Symbol_*>,_slang::Hasher<const_slang::ast::Scope_*>_>,_std::equal_to<const_slang::ast::Scope_*>,_ska::detailv3::KeyOrValueEquality<const_slang::ast::Scope_*,_std::pair<const_slang::ast::Scope_*,_const_slang::ast::Symbol_*>,_std::equal_to<const_slang::ast::Scope_*>_>,_std::allocator<std::pair<const_slang::ast::Scope_*,_const_slang::ast::Symbol_*>_>,_std::allocator<ska::detailv3::sherwood_v3_entry<std::pair<const_slang::ast::Scope_*,_const_slang::ast::Symbol_*>_>_>_>::templated_iterator<std::pair<const_slang::ast::Scope_*,_const_slang::ast::Symbol_*>_>,_bool>
 __thiscall
ska::detailv3::
sherwood_v3_table<std::pair<slang::ast::Scope_const*,slang::ast::Symbol_const*>,slang::ast::Scope_const*,slang::Hasher<slang::ast::Scope_const*>,ska::detailv3::KeyOrValueHasher<slang::ast::Scope_const*,std::pair<slang::ast::Scope_const*,slang::ast::Symbol_const*>,slang::Hasher<slang::ast::Scope_const*>>,std::equal_to<slang::ast::Scope_const*>,ska::detailv3::KeyOrValueEquality<slang::ast::Scope_const*,std::pair<slang::ast::Scope_const*,slang::ast::Symbol_const*>,std::equal_to<slang::ast::Scope_const*>>,std::allocator<std::pair<slang::ast::Scope_const*,slang::ast::Symbol_const*>>,std::allocator<ska::detailv3::sherwood_v3_entry<std::pair<slang::ast::Scope_const*,slang::ast::Symbol_const*>>>>
::emplace<std::pair<slang::ast::Scope_const*,slang::ast::Symbol_const*>>
          (sherwood_v3_table<std::pair<slang::ast::Scope_const*,slang::ast::Symbol_const*>,slang::ast::Scope_const*,slang::Hasher<slang::ast::Scope_const*>,ska::detailv3::KeyOrValueHasher<slang::ast::Scope_const*,std::pair<slang::ast::Scope_const*,slang::ast::Symbol_const*>,slang::Hasher<slang::ast::Scope_const*>>,std::equal_to<slang::ast::Scope_const*>,ska::detailv3::KeyOrValueEquality<slang::ast::Scope_const*,std::pair<slang::ast::Scope_const*,slang::ast::Symbol_const*>,std::equal_to<slang::ast::Scope_const*>>,std::allocator<std::pair<slang::ast::Scope_const*,slang::ast::Symbol_const*>>,std::allocator<ska::detailv3::sherwood_v3_entry<std::pair<slang::ast::Scope_const*,slang::ast::Symbol_const*>>>>
           *this,pair<const_slang::ast::Scope_*,_const_slang::ast::Symbol_*> *key)

{
  bool bVar1;
  size_t hash;
  undefined8 extraout_RDX;
  pair<ska::detailv3::sherwood_v3_table<std::pair<const_slang::ast::Scope_*,_const_slang::ast::Symbol_*>,_const_slang::ast::Scope_*,_slang::Hasher<const_slang::ast::Scope_*>,_ska::detailv3::KeyOrValueHasher<const_slang::ast::Scope_*,_std::pair<const_slang::ast::Scope_*,_const_slang::ast::Symbol_*>,_slang::Hasher<const_slang::ast::Scope_*>_>,_std::equal_to<const_slang::ast::Scope_*>,_ska::detailv3::KeyOrValueEquality<const_slang::ast::Scope_*,_std::pair<const_slang::ast::Scope_*,_const_slang::ast::Symbol_*>,_std::equal_to<const_slang::ast::Scope_*>_>,_std::allocator<std::pair<const_slang::ast::Scope_*,_const_slang::ast::Symbol_*>_>,_std::allocator<ska::detailv3::sherwood_v3_entry<std::pair<const_slang::ast::Scope_*,_const_slang::ast::Symbol_*>_>_>_>::templated_iterator<std::pair<const_slang::ast::Scope_*,_const_slang::ast::Symbol_*>_>,_bool>
  pVar2;
  pair<ska::detailv3::sherwood_v3_table<std::pair<const_slang::ast::Scope_*,_const_slang::ast::Symbol_*>,_const_slang::ast::Scope_*,_slang::Hasher<const_slang::ast::Scope_*>,_ska::detailv3::KeyOrValueHasher<const_slang::ast::Scope_*,_std::pair<const_slang::ast::Scope_*,_const_slang::ast::Symbol_*>,_slang::Hasher<const_slang::ast::Scope_*>_>,_std::equal_to<const_slang::ast::Scope_*>,_ska::detailv3::KeyOrValueEquality<const_slang::ast::Scope_*,_std::pair<const_slang::ast::Scope_*,_const_slang::ast::Symbol_*>,_std::equal_to<const_slang::ast::Scope_*>_>,_std::allocator<std::pair<const_slang::ast::Scope_*,_const_slang::ast::Symbol_*>_>,_std::allocator<ska::detailv3::sherwood_v3_entry<std::pair<const_slang::ast::Scope_*,_const_slang::ast::Symbol_*>_>_>_>::templated_iterator<std::pair<const_slang::ast::Scope_*,_const_slang::ast::Symbol_*>_>,_bool>
  pVar3;
  bool local_49;
  templated_iterator<std::pair<const_slang::ast::Scope_*,_const_slang::ast::Symbol_*>_> local_48;
  char local_39;
  EntryPointer psStack_38;
  int8_t distance_from_desired;
  EntryPointer current_entry;
  size_t index;
  pair<const_slang::ast::Scope_*,_const_slang::ast::Symbol_*> *key_local;
  sherwood_v3_table<std::pair<const_slang::ast::Scope_*,_const_slang::ast::Symbol_*>,_const_slang::ast::Scope_*,_slang::Hasher<const_slang::ast::Scope_*>,_ska::detailv3::KeyOrValueHasher<const_slang::ast::Scope_*,_std::pair<const_slang::ast::Scope_*,_const_slang::ast::Symbol_*>,_slang::Hasher<const_slang::ast::Scope_*>_>,_std::equal_to<const_slang::ast::Scope_*>,_ska::detailv3::KeyOrValueEquality<const_slang::ast::Scope_*,_std::pair<const_slang::ast::Scope_*,_const_slang::ast::Symbol_*>,_std::equal_to<const_slang::ast::Scope_*>_>,_std::allocator<std::pair<const_slang::ast::Scope_*,_const_slang::ast::Symbol_*>_>,_std::allocator<ska::detailv3::sherwood_v3_entry<std::pair<const_slang::ast::Scope_*,_const_slang::ast::Symbol_*>_>_>_>
  *this_local;
  bool local_10;
  
  index = (size_t)key;
  key_local = (pair<const_slang::ast::Scope_*,_const_slang::ast::Symbol_*> *)this;
  hash = hash_object<std::pair<slang::ast::Scope_const*,slang::ast::Symbol_const*>>(this,key);
  current_entry =
       (EntryPointer)
       fibonacci_hash_policy::index_for_hash
                 ((fibonacci_hash_policy *)(this + 0x10),hash,*(size_t *)(this + 8));
  psStack_38 = (EntryPointer)(*(long *)this + (long)current_entry * 0x18);
  local_39 = '\0';
  do {
    if (psStack_38->distance_from_desired < local_39) {
      pVar2 = emplace_new_key<std::pair<slang::ast::Scope_const*,slang::ast::Symbol_const*>>
                        (this,local_39,psStack_38,
                         (pair<const_slang::ast::Scope_*,_const_slang::ast::Symbol_*> *)index);
      local_10 = pVar2.second;
LAB_003bdede:
      this_local = (sherwood_v3_table<std::pair<const_slang::ast::Scope_*,_const_slang::ast::Symbol_*>,_const_slang::ast::Scope_*,_slang::Hasher<const_slang::ast::Scope_*>,_ska::detailv3::KeyOrValueHasher<const_slang::ast::Scope_*,_std::pair<const_slang::ast::Scope_*,_const_slang::ast::Symbol_*>,_slang::Hasher<const_slang::ast::Scope_*>_>,_std::equal_to<const_slang::ast::Scope_*>,_ska::detailv3::KeyOrValueEquality<const_slang::ast::Scope_*,_std::pair<const_slang::ast::Scope_*,_const_slang::ast::Symbol_*>,_std::equal_to<const_slang::ast::Scope_*>_>,_std::allocator<std::pair<const_slang::ast::Scope_*,_const_slang::ast::Symbol_*>_>,_std::allocator<ska::detailv3::sherwood_v3_entry<std::pair<const_slang::ast::Scope_*,_const_slang::ast::Symbol_*>_>_>_>
                    *)pVar2.first.current;
      pVar3._9_7_ = pVar2._9_7_;
      pVar3.second = local_10;
      pVar3.first.current = (EntryPointer)this_local;
      return pVar3;
    }
    bVar1 = compares_equal<std::pair<slang::ast::Scope_const*,slang::ast::Symbol_const*>,std::pair<slang::ast::Scope_const*,slang::ast::Symbol_const*>>
                      (this,(pair<const_slang::ast::Scope_*,_const_slang::ast::Symbol_*> *)index,
                       &(psStack_38->field_1).value);
    if (bVar1) {
      sherwood_v3_table<std::pair<const_slang::ast::Scope_*,_const_slang::ast::Symbol_*>,_const_slang::ast::Scope_*,_slang::Hasher<const_slang::ast::Scope_*>,_ska::detailv3::KeyOrValueHasher<const_slang::ast::Scope_*,_std::pair<const_slang::ast::Scope_*,_const_slang::ast::Symbol_*>,_slang::Hasher<const_slang::ast::Scope_*>_>,_std::equal_to<const_slang::ast::Scope_*>,_ska::detailv3::KeyOrValueEquality<const_slang::ast::Scope_*,_std::pair<const_slang::ast::Scope_*,_const_slang::ast::Symbol_*>,_std::equal_to<const_slang::ast::Scope_*>_>,_std::allocator<std::pair<const_slang::ast::Scope_*,_const_slang::ast::Symbol_*>_>,_std::allocator<ska::detailv3::sherwood_v3_entry<std::pair<const_slang::ast::Scope_*,_const_slang::ast::Symbol_*>_>_>_>
      ::templated_iterator<std::pair<const_slang::ast::Scope_*,_const_slang::ast::Symbol_*>_>::
      templated_iterator(&local_48,psStack_38);
      local_49 = false;
      std::
      pair<ska::detailv3::sherwood_v3_table<std::pair<const_slang::ast::Scope_*,_const_slang::ast::Symbol_*>,_const_slang::ast::Scope_*,_slang::Hasher<const_slang::ast::Scope_*>,_ska::detailv3::KeyOrValueHasher<const_slang::ast::Scope_*,_std::pair<const_slang::ast::Scope_*,_const_slang::ast::Symbol_*>,_slang::Hasher<const_slang::ast::Scope_*>_>,_std::equal_to<const_slang::ast::Scope_*>,_ska::detailv3::KeyOrValueEquality<const_slang::ast::Scope_*,_std::pair<const_slang::ast::Scope_*,_const_slang::ast::Symbol_*>,_std::equal_to<const_slang::ast::Scope_*>_>,_std::allocator<std::pair<const_slang::ast::Scope_*,_const_slang::ast::Symbol_*>_>,_std::allocator<ska::detailv3::sherwood_v3_entry<std::pair<const_slang::ast::Scope_*,_const_slang::ast::Symbol_*>_>_>_>::templated_iterator<std::pair<const_slang::ast::Scope_*,_const_slang::ast::Symbol_*>_>,_bool>
      ::pair<bool,_true>((pair<ska::detailv3::sherwood_v3_table<std::pair<const_slang::ast::Scope_*,_const_slang::ast::Symbol_*>,_const_slang::ast::Scope_*,_slang::Hasher<const_slang::ast::Scope_*>,_ska::detailv3::KeyOrValueHasher<const_slang::ast::Scope_*,_std::pair<const_slang::ast::Scope_*,_const_slang::ast::Symbol_*>,_slang::Hasher<const_slang::ast::Scope_*>_>,_std::equal_to<const_slang::ast::Scope_*>,_ska::detailv3::KeyOrValueEquality<const_slang::ast::Scope_*,_std::pair<const_slang::ast::Scope_*,_const_slang::ast::Symbol_*>,_std::equal_to<const_slang::ast::Scope_*>_>,_std::allocator<std::pair<const_slang::ast::Scope_*,_const_slang::ast::Symbol_*>_>,_std::allocator<ska::detailv3::sherwood_v3_entry<std::pair<const_slang::ast::Scope_*,_const_slang::ast::Symbol_*>_>_>_>::templated_iterator<std::pair<const_slang::ast::Scope_*,_const_slang::ast::Symbol_*>_>,_bool>
                          *)&this_local,&local_48,&local_49);
      pVar2._8_8_ = extraout_RDX;
      pVar2.first.current = (EntryPointer)this_local;
      goto LAB_003bdede;
    }
    psStack_38 = psStack_38 + 1;
    local_39 = local_39 + '\x01';
  } while( true );
}

Assistant:

std::pair<iterator, bool> emplace(Key && key, Args &&... args)
    {
        size_t index = hash_policy.index_for_hash(hash_object(key), num_slots_minus_one);
        EntryPointer current_entry = entries + ptrdiff_t(index);
        int8_t distance_from_desired = 0;
        for (; current_entry->distance_from_desired >= distance_from_desired; ++current_entry, ++distance_from_desired)
        {
            if (compares_equal(key, current_entry->value))
                return { { current_entry }, false };
        }
        return emplace_new_key(distance_from_desired, current_entry, std::forward<Key>(key), std::forward<Args>(args)...);
    }